

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall irr::gui::CGUITabControl::recalculateScrollButtonPlacement(CGUITabControl *this)

{
  EGUI_ALIGNMENT right;
  int iVar1;
  IGUIElement *this_00;
  EGUI_ALIGNMENT top;
  EGUI_ALIGNMENT EVar2;
  long in_RDI;
  s32 ButtonY;
  s32 ButtonX;
  s32 ButtonHeight;
  s32 ButtonSize;
  IGUISkin *skin;
  undefined8 in_stack_ffffffffffffffb0;
  rect<int> *in_stack_ffffffffffffffc0;
  EGUI_ALIGNMENT left;
  
  this_00 = (IGUIElement *)(**(code **)(**(long **)(in_RDI + 0x128) + 0x60))();
  left = 0x10;
  right = *(int *)(in_RDI + 0x160) - EGUIA_CENTER;
  if ((int)right < 0) {
    right = *(EGUI_ALIGNMENT *)(in_RDI + 0x160);
  }
  if ((this_00 != (IGUIElement *)0x0) &&
     (left = (*(this_00->super_IEventReceiver)._vptr_IEventReceiver[2])(this_00,2),
     *(int *)(in_RDI + 0x160) < (int)left)) {
    left = *(EGUI_ALIGNMENT *)(in_RDI + 0x160);
  }
  iVar1 = core::rect<int>::getWidth((rect<int> *)(in_RDI + 0x30));
  top = (iVar1 - (int)((float)(int)left * 2.5)) - EGUIA_LOWERRIGHT;
  if (*(int *)(in_RDI + 0x164) == 0) {
    EVar2 = (*(int *)(in_RDI + 0x160) / 2 + 2) - (int)right / 2;
    IGUIElement::setAlignment(this_00,left,right,top,EVar2);
    IGUIElement::setAlignment(this_00,left,right,top,EVar2);
  }
  else {
    iVar1 = core::rect<int>::getHeight((rect<int> *)(in_RDI + 0x30));
    EVar2 = ((iVar1 - *(int *)(in_RDI + 0x160) / 2) - (int)right / 2) - EGUIA_CENTER;
    IGUIElement::setAlignment(this_00,left,right,top,EVar2);
    IGUIElement::setAlignment(this_00,left,right,top,EVar2);
  }
  core::rect<int>::rect
            (in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0);
  IGUIElement::setRelativePosition(this_00,(rect<int> *)CONCAT44(left,right));
  core::rect<int>::rect
            (in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
             (int)((ulong)*(undefined8 *)(in_RDI + 0x170) >> 0x20),
             (int)*(undefined8 *)(in_RDI + 0x170));
  IGUIElement::setRelativePosition(this_00,(rect<int> *)CONCAT44(left,right));
  return;
}

Assistant:

void CGUITabControl::recalculateScrollButtonPlacement()
{
	IGUISkin *skin = Environment->getSkin();
	s32 ButtonSize = 16;
	s32 ButtonHeight = TabHeight - 2;
	if (ButtonHeight < 0)
		ButtonHeight = TabHeight;
	if (skin) {
		ButtonSize = skin->getSize(EGDS_WINDOW_BUTTON_WIDTH);
		if (ButtonSize > TabHeight)
			ButtonSize = TabHeight;
	}

	s32 ButtonX = RelativeRect.getWidth() - (s32)(2.5f * (f32)ButtonSize) - 1;
	s32 ButtonY = 0;

	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		ButtonY = 2 + (TabHeight / 2) - (ButtonHeight / 2);
		UpButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_UPPERLEFT, EGUIA_UPPERLEFT);
	} else {
		ButtonY = RelativeRect.getHeight() - (TabHeight / 2) - (ButtonHeight / 2) - 2;
		UpButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT);
		DownButton->setAlignment(EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT, EGUIA_LOWERRIGHT);
	}

	UpButton->setRelativePosition(core::rect<s32>(ButtonX, ButtonY, ButtonX + ButtonSize, ButtonY + ButtonHeight));
	ButtonX += ButtonSize + 1;
	DownButton->setRelativePosition(core::rect<s32>(ButtonX, ButtonY, ButtonX + ButtonSize, ButtonY + ButtonHeight));
}